

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O0

void __thiscall quantum::QuantumComputer::extendRegister(QuantumComputer *this,int resizeAmount)

{
  ostream *poVar1;
  size_type sVar2;
  double dVar3;
  double dVar4;
  value_type_conflict local_28;
  int local_20;
  int local_1c;
  int i;
  int elementsToAdd;
  int sizeOfBaseVector;
  int resizeAmount_local;
  QuantumComputer *this_local;
  
  elementsToAdd = resizeAmount;
  _sizeOfBaseVector = this;
  if (this->registerSize < resizeAmount) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->baseVector);
    i = (int)sVar2;
    local_1c = elementsToAdd - this->registerSize;
    if (local_1c < 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Number of Qubits to add must be positive");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      dVar3 = pow(2.0,(double)this->registerSize);
      local_20 = (int)dVar3;
      while( true ) {
        dVar3 = (double)local_20;
        dVar4 = pow(2.0,(double)elementsToAdd);
        if (dVar4 <= dVar3) break;
        local_28 = 0.0;
        std::vector<double,_std::allocator<double>_>::push_back(&this->baseVector,&local_28);
        local_20 = local_20 + 1;
      }
      this->registerSize = elementsToAdd;
      poVar1 = std::operator<<((ostream *)&std::cout,"Register resized correctly");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"Number of qubits in register: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,elementsToAdd);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"You can only resize your register, not decrease"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void quantum::QuantumComputer::extendRegister(int resizeAmount) {
    if (this->registerSize >= resizeAmount) {
        std::cout << "You can only resize your register, not decrease" << std::endl;
        return;
    }

    int sizeOfBaseVector = (int) this->baseVector.size();

    int elementsToAdd = resizeAmount - this->registerSize;
    if (elementsToAdd < 0) {
        std::cout << "Number of Qubits to add must be positive" << std::endl;
        return;
    }

    for (int i = pow(2, this->registerSize); i < pow(2, resizeAmount); i++) {
        this->baseVector.push_back(0);
    }

    this->registerSize = resizeAmount;

    std::cout << "Register resized correctly" << std::endl;
    std::cout << "Number of qubits in register: " << resizeAmount << std::endl;

}